

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O2

void sptk::world::anon_unknown_5::HarvestGeneralBody
               (double *x,int x_length,int fs,int frame_period,double f0_floor,double f0_ceil,
               double channels_in_octave,int speed,double allowed_range,double *temporal_positions,
               double *f0)

{
  double dVar1;
  double **f0_candidates;
  undefined8 uVar2;
  fft_complex adVar3;
  fft_complex adVar4;
  undefined1 auVar5 [16];
  double dVar6;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  fft_plan p_04;
  fft_plan p_05;
  fft_plan p_06;
  undefined8 uVar7;
  double *pdVar8;
  int i;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint x_length_00;
  uint x_length_01;
  uint x_length_02;
  double *pdVar15;
  double *in;
  fft_complex *out;
  long lVar16;
  long *plVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  double *pdVar21;
  double *pdVar22;
  fft_complex *padVar23;
  double *pdVar24;
  double *pdVar25;
  double *interval_locations;
  double *intervals;
  double *intervals_00;
  double *intervals_01;
  double *intervals_02;
  undefined4 *puVar26;
  void *pvVar27;
  ulong uVar28;
  void *pvVar29;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  void *pvVar33;
  ulong uVar34;
  double *pdVar35;
  int *piVar36;
  double **ppdVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long *plVar46;
  int i_9;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  int j_7;
  fft_plan *pfVar50;
  ulong uVar51;
  ulong uVar52;
  undefined8 *puVar53;
  undefined4 in_register_00000084;
  int j_1;
  int i_14;
  uint uVar54;
  uint uVar55;
  long lVar56;
  long *plVar57;
  int j_4;
  long lVar58;
  int i_2;
  long lVar59;
  ulong uVar60;
  int i_19;
  long lVar61;
  ulong uVar62;
  bool bVar63;
  byte bVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  double *in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd58 [56];
  double *in_stack_fffffffffffffd90;
  double local_268;
  int maximum_number;
  fft_plan forwardFFT;
  double error2;
  
  pdVar35 = (double *)CONCAT44(in_register_00000084,speed);
  bVar64 = 0;
  dVar71 = log((f0_ceil * 1.1) / (f0_floor * 0.9));
  iVar9 = (int)((dVar71 / 0.6931471805599453) * 40.0);
  lVar61 = (long)iVar9;
  uVar49 = lVar61 + 1;
  uVar34 = lVar61 * 8 + 8;
  if (iVar9 < -1) {
    uVar34 = 0xffffffffffffffff;
  }
  pdVar15 = (double *)operator_new__(uVar34);
  lVar40 = 0;
  while (lVar40 <= lVar61) {
    dVar71 = exp2((double)(int)(lVar40 + 1) / 40.0);
    pdVar15[lVar40] = dVar71 * f0_floor * 0.9;
    lVar40 = lVar40 + 1;
  }
  iVar11 = 0xc;
  if (frame_period < 0xc) {
    iVar11 = frame_period;
  }
  iVar12 = 1;
  if (1 < iVar11) {
    iVar12 = iVar11;
  }
  dVar67 = (double)iVar12;
  dVar71 = ceil((double)x_length / dVar67);
  uVar38 = (uint)dVar71;
  uVar28 = (ulong)uVar38;
  dVar71 = (double)fs / dVar67;
  uVar10 = GetSuitableFFTSize(uVar38 + (int)((dVar71 + dVar71) / *pdVar15) * 2 + 5);
  lVar40 = (long)(int)uVar10;
  uVar47 = 0;
  uVar62 = 0;
  if (0 < (int)uVar10) {
    uVar62 = (ulong)uVar10;
  }
  uVar45 = lVar40 << 4;
  if ((int)uVar10 < 0) {
    uVar45 = 0xffffffffffffffff;
  }
  uVar52 = lVar40 * 8;
  if ((int)uVar10 < 0) {
    uVar52 = 0xffffffffffffffff;
  }
  in = (double *)operator_new__(uVar52);
  out = (fft_complex *)operator_new__(uVar45);
  for (; uVar62 != uVar47; uVar47 = uVar47 + 1) {
    in[uVar47] = 0.0;
  }
  if (frame_period < 2) {
    uVar62 = 0;
    uVar47 = (ulong)(uint)x_length;
    if (x_length < 1) {
      uVar47 = uVar62;
    }
    for (; uVar47 != uVar62; uVar62 = uVar62 + 1) {
      in[uVar62] = x[uVar62];
    }
    uVar47 = 0;
    if (0 < (int)uVar38) {
      uVar47 = uVar28;
    }
  }
  else {
    dVar68 = ceil(140.0 / dVar67);
    uVar55 = (uint)(dVar68 * dVar67);
    uVar54 = x_length + uVar55 * 2;
    uVar62 = 0;
    uVar47 = (long)(int)uVar54 * 8;
    if ((int)uVar54 < 0) {
      uVar47 = 0xffffffffffffffff;
    }
    uVar48 = 0;
    if (0 < (int)uVar54) {
      uVar48 = (ulong)uVar54;
    }
    pdVar21 = (double *)operator_new__(uVar47);
    for (; uVar48 != uVar62; uVar62 = uVar62 + 1) {
      pdVar21[uVar62] = 0.0;
    }
    pdVar22 = (double *)operator_new__(uVar47);
    uVar47 = 0;
    uVar62 = 0;
    if (0 < (int)uVar55) {
      uVar62 = (ulong)uVar55;
    }
    for (; uVar62 != uVar47; uVar47 = uVar47 + 1) {
      pdVar22[uVar47] = *x;
    }
    lVar16 = (long)(int)(uVar55 + x_length);
    pdVar24 = x;
    for (lVar41 = (long)(int)uVar55; lVar41 < lVar16; lVar41 = lVar41 + 1) {
      pdVar22[lVar41] = *pdVar24;
      pdVar24 = pdVar24 + 1;
    }
    for (; lVar16 < (int)uVar54; lVar16 = lVar16 + 1) {
      pdVar22[lVar16] = x[(long)x_length + -1];
    }
    decimate(pdVar22,uVar54,iVar12,pdVar21);
    uVar62 = 0;
    uVar47 = 0;
    if (0 < (int)uVar38) {
      uVar47 = uVar28;
    }
    for (; uVar47 != uVar62; uVar62 = uVar62 + 1) {
      in[uVar62] = pdVar21[(long)((int)uVar55 / iVar12) + uVar62];
    }
    operator_delete__(pdVar22);
    operator_delete__(pdVar21);
  }
  dVar67 = 0.0;
  for (uVar62 = 0; uVar47 != uVar62; uVar62 = uVar62 + 1) {
    dVar67 = dVar67 + in[uVar62];
  }
  for (uVar62 = 0; uVar47 != uVar62; uVar62 = uVar62 + 1) {
    in[uVar62] = in[uVar62] - dVar67 / (double)(int)uVar38;
  }
  for (lVar16 = (long)(int)uVar38; lVar16 < lVar40; lVar16 = lVar16 + 1) {
    in[lVar16] = 0.0;
  }
  fft_plan_dft_r2c_1d(&forwardFFT,uVar10,in,out,3);
  lVar16 = 9;
  pfVar50 = &forwardFFT;
  puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
  for (lVar41 = lVar16; lVar41 != 0; lVar41 = lVar41 + -1) {
    *puVar53 = *(undefined8 *)pfVar50;
    pfVar50 = (fft_plan *)((long)pfVar50 + (ulong)bVar64 * -0x10 + 8);
    puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
  }
  p.sign = in_stack_fffffffffffffd4c;
  p.n = in_stack_fffffffffffffd48;
  p._8_8_ = in_stack_fffffffffffffd50;
  p.c_in = (fft_complex *)in_stack_fffffffffffffd58._0_8_;
  p.in = (double *)in_stack_fffffffffffffd58._8_8_;
  p.c_out = (fft_complex *)in_stack_fffffffffffffd58._16_8_;
  p.out = (double *)in_stack_fffffffffffffd58._24_8_;
  p.input = (double *)in_stack_fffffffffffffd58._32_8_;
  p.ip = (int *)in_stack_fffffffffffffd58._40_8_;
  p.w = (double *)in_stack_fffffffffffffd58._48_8_;
  fft_execute(p);
  pfVar50 = &forwardFFT;
  puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
  for (; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar53 = *(undefined8 *)pfVar50;
    pfVar50 = (fft_plan *)((long)pfVar50 + (ulong)bVar64 * -0x10 + 8);
    puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
  }
  p_04.flags = in_stack_fffffffffffffd58._0_4_;
  p_04._12_4_ = in_stack_fffffffffffffd58._4_4_;
  p_04.c_in = (fft_complex *)in_stack_fffffffffffffd58._8_8_;
  p_04.in = (double *)in_stack_fffffffffffffd58._16_8_;
  p_04.c_out = (fft_complex *)in_stack_fffffffffffffd58._24_8_;
  p_04.out = (double *)in_stack_fffffffffffffd58._32_8_;
  p_04.input = (double *)in_stack_fffffffffffffd58._40_8_;
  p_04.ip = (int *)in_stack_fffffffffffffd58._48_8_;
  p_04._0_8_ = in_stack_fffffffffffffd50;
  p_04.w = in_stack_fffffffffffffd90;
  fft_destroy_plan(p_04);
  iVar11 = (int)(((double)x_length * 1000.0) / (double)fs);
  lVar41 = (long)iVar11;
  for (lVar16 = 0; lVar16 <= lVar41; lVar16 = lVar16 + 1) {
    pdVar35[lVar16] = (double)(int)lVar16 / 1000.0;
    temporal_positions[lVar16] = 0.0;
  }
  uVar54 = iVar11 + 1;
  iVar12 = matlab_round((double)(int)uVar49 / 10.0);
  lVar16 = (long)(int)uVar54;
  uVar47 = lVar16 * 8;
  if (iVar11 < -1) {
    uVar47 = 0xffffffffffffffff;
  }
  plVar17 = (long *)operator_new__(uVar47);
  pvVar18 = operator_new__(uVar47);
  uVar62 = (long)(iVar12 * 7) * 8;
  if (iVar12 < 0) {
    uVar62 = 0xffffffffffffffff;
  }
  for (lVar59 = 0; lVar59 <= lVar41; lVar59 = lVar59 + 1) {
    pvVar19 = operator_new__(uVar62);
    plVar17[lVar59] = (long)pvVar19;
    pvVar19 = operator_new__(uVar62);
    *(void **)((long)pvVar18 + lVar59 * 8) = pvVar19;
  }
  pvVar19 = operator_new__(uVar34);
  uVar34 = lVar16 * 8;
  if (iVar11 < -1) {
    uVar34 = 0xffffffffffffffff;
  }
  uVar48 = 0;
  uVar62 = 0;
  if (0 < (int)uVar49) {
    uVar62 = uVar49 & 0xffffffff;
  }
  for (; uVar62 != uVar48; uVar48 = uVar48 + 1) {
    pvVar20 = operator_new__(uVar34);
    *(void **)((long)pvVar19 + uVar48 * 8) = pvVar20;
  }
  uVar51 = 0;
  uVar48 = 0;
  if (0 < (int)uVar38) {
    uVar48 = uVar28;
  }
  uVar28 = uVar28 << 3;
  if ((int)uVar38 < 0) {
    uVar28 = 0xffffffffffffffff;
  }
  uVar55 = uVar38 - 1;
  uVar60 = 0;
  if (0 < (int)uVar55) {
    uVar60 = (ulong)uVar55;
  }
  uVar42 = 0;
  if (0 < (int)uVar54) {
    uVar42 = (ulong)uVar54;
  }
  for (; uVar51 != uVar62; uVar51 = uVar51 + 1) {
    dVar67 = pdVar15[uVar51];
    lVar59 = *(long *)((long)pvVar19 + uVar51 * 8);
    pdVar21 = (double *)operator_new__(uVar52);
    iVar13 = matlab_round(dVar71 / dVar67 + dVar71 / dVar67);
    pdVar22 = (double *)operator_new__(uVar52);
    iVar39 = iVar13 * 2 + 1;
    NuttallWindow(iVar39,pdVar22);
    lVar58 = (long)iVar13;
    for (lVar56 = (long)-iVar13; lVar56 <= lVar58; lVar56 = lVar56 + 1) {
      dVar68 = cos(((double)(int)lVar56 * dVar67 * 6.283185307179586) / dVar71);
      pdVar22[lVar58 + lVar56] = dVar68 * pdVar22[lVar58 + lVar56];
    }
    for (lVar56 = (long)iVar39; lVar56 < lVar40; lVar56 = lVar56 + 1) {
      pdVar22[lVar56] = 0.0;
    }
    padVar23 = (fft_complex *)operator_new__(uVar45);
    fft_plan_dft_r2c_1d(&forwardFFT,uVar10,pdVar22,padVar23,3);
    pfVar50 = &forwardFFT;
    puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
    for (lVar56 = 9; lVar56 != 0; lVar56 = lVar56 + -1) {
      *puVar53 = *(undefined8 *)pfVar50;
      pfVar50 = (fft_plan *)((long)pfVar50 + (ulong)bVar64 * -0x10 + 8);
      puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
    }
    p_00.sign = in_stack_fffffffffffffd4c;
    p_00.n = in_stack_fffffffffffffd48;
    p_00._8_8_ = in_stack_fffffffffffffd50;
    p_00.c_in = (fft_complex *)in_stack_fffffffffffffd58._0_8_;
    p_00.in = (double *)in_stack_fffffffffffffd58._8_8_;
    p_00.c_out = (fft_complex *)in_stack_fffffffffffffd58._16_8_;
    p_00.out = (double *)in_stack_fffffffffffffd58._24_8_;
    p_00.input = (double *)in_stack_fffffffffffffd58._32_8_;
    p_00.ip = (int *)in_stack_fffffffffffffd58._40_8_;
    p_00.w = (double *)in_stack_fffffffffffffd58._48_8_;
    fft_execute(p_00);
    dVar68 = (*out)[0] * (*padVar23)[1] + (*padVar23)[0] * (*out)[1];
    adVar3[1]._0_4_ = SUB84(dVar68,0);
    adVar3[0] = (*out)[0] * (*padVar23)[0] + (*padVar23)[1] * -(*out)[1];
    adVar3[1]._4_4_ = (int)((ulong)dVar68 >> 0x20);
    *padVar23 = adVar3;
    lVar56 = 0x10;
    iVar39 = uVar10 - 2;
    for (lVar44 = 1; lVar44 <= (int)uVar10 / 2; lVar44 = lVar44 + 1) {
      dVar68 = *(double *)((long)*out + lVar56);
      dVar69 = *(double *)((long)*out + lVar56 + 8);
      pdVar24 = (double *)((long)*padVar23 + lVar56);
      dVar6 = *pdVar24;
      dVar1 = pdVar24[1];
      dVar70 = dVar68 * dVar6 + dVar1 * -dVar69;
      dVar68 = dVar68 * dVar1 + dVar6 * dVar69;
      uVar65 = SUB84(dVar68,0);
      uVar66 = (undefined4)((ulong)dVar68 >> 0x20);
      auVar74._8_4_ = uVar65;
      auVar74._0_8_ = dVar70;
      auVar74._12_4_ = uVar66;
      *(undefined1 (*) [16])((long)*padVar23 + lVar56) = auVar74;
      adVar4[1]._0_4_ = uVar65;
      adVar4[0] = dVar70;
      adVar4[1]._4_4_ = uVar66;
      padVar23[iVar39] = adVar4;
      iVar39 = iVar39 + -1;
      lVar56 = lVar56 + 0x10;
    }
    fft_plan_dft_c2r_1d((fft_plan *)&error2,uVar10,padVar23,pdVar21,3);
    pfVar50 = (fft_plan *)&error2;
    puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
    for (lVar56 = 9; lVar56 != 0; lVar56 = lVar56 + -1) {
      *puVar53 = *(undefined8 *)pfVar50;
      pfVar50 = (fft_plan *)((long)pfVar50 + (ulong)bVar64 * -0x10 + 8);
      puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
    }
    p_01.sign = in_stack_fffffffffffffd4c;
    p_01.n = in_stack_fffffffffffffd48;
    p_01._8_8_ = in_stack_fffffffffffffd50;
    p_01.c_in = (fft_complex *)in_stack_fffffffffffffd58._0_8_;
    p_01.in = (double *)in_stack_fffffffffffffd58._8_8_;
    p_01.c_out = (fft_complex *)in_stack_fffffffffffffd58._16_8_;
    p_01.out = (double *)in_stack_fffffffffffffd58._24_8_;
    p_01.input = (double *)in_stack_fffffffffffffd58._32_8_;
    p_01.ip = (int *)in_stack_fffffffffffffd58._40_8_;
    p_01.w = (double *)in_stack_fffffffffffffd58._48_8_;
    fft_execute(p_01);
    for (uVar43 = 0; uVar48 != uVar43; uVar43 = uVar43 + 1) {
      pdVar21[uVar43] = pdVar21[lVar58 + uVar43 + 1];
    }
    lVar56 = 9;
    pdVar24 = &error2;
    pdVar25 = (double *)&stack0xfffffffffffffd48;
    for (lVar58 = lVar56; lVar58 != 0; lVar58 = lVar58 + -1) {
      *pdVar25 = *pdVar24;
      pdVar24 = pdVar24 + (ulong)bVar64 * -2 + 1;
      pdVar25 = pdVar25 + (ulong)bVar64 * -2 + 1;
    }
    p_05.flags = in_stack_fffffffffffffd58._0_4_;
    p_05._12_4_ = in_stack_fffffffffffffd58._4_4_;
    p_05.c_in = (fft_complex *)in_stack_fffffffffffffd58._8_8_;
    p_05.in = (double *)in_stack_fffffffffffffd58._16_8_;
    p_05.c_out = (fft_complex *)in_stack_fffffffffffffd58._24_8_;
    p_05.out = (double *)in_stack_fffffffffffffd58._32_8_;
    p_05.input = (double *)in_stack_fffffffffffffd58._40_8_;
    p_05.ip = (int *)in_stack_fffffffffffffd58._48_8_;
    p_05._0_8_ = in_stack_fffffffffffffd50;
    p_05.w = in_stack_fffffffffffffd90;
    fft_destroy_plan(p_05);
    pfVar50 = &forwardFFT;
    puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
    for (; lVar56 != 0; lVar56 = lVar56 + -1) {
      *puVar53 = *(undefined8 *)pfVar50;
      pfVar50 = (fft_plan *)((long)pfVar50 + (ulong)bVar64 * -0x10 + 8);
      puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
    }
    p_06.flags = in_stack_fffffffffffffd58._0_4_;
    p_06._12_4_ = in_stack_fffffffffffffd58._4_4_;
    p_06.c_in = (fft_complex *)in_stack_fffffffffffffd58._8_8_;
    p_06.in = (double *)in_stack_fffffffffffffd58._16_8_;
    p_06.c_out = (fft_complex *)in_stack_fffffffffffffd58._24_8_;
    p_06.out = (double *)in_stack_fffffffffffffd58._32_8_;
    p_06.input = (double *)in_stack_fffffffffffffd58._40_8_;
    p_06.ip = (int *)in_stack_fffffffffffffd58._48_8_;
    p_06._0_8_ = in_stack_fffffffffffffd50;
    p_06.w = in_stack_fffffffffffffd90;
    fft_destroy_plan(p_06);
    operator_delete__(padVar23);
    operator_delete__(pdVar22);
    pdVar22 = (double *)operator_new__(uVar28);
    pdVar24 = (double *)operator_new__(uVar28);
    pdVar25 = (double *)operator_new__(uVar28);
    interval_locations = (double *)operator_new__(uVar28);
    intervals = (double *)operator_new__(uVar28);
    intervals_00 = (double *)operator_new__(uVar28);
    intervals_01 = (double *)operator_new__(uVar28);
    intervals_02 = (double *)operator_new__(uVar28);
    uVar14 = ZeroCrossingEngine(pdVar21,uVar38,dVar71,pdVar22,intervals);
    for (uVar43 = 0; uVar48 != uVar43; uVar43 = uVar43 + 1) {
      pdVar21[uVar43] = -pdVar21[uVar43];
    }
    x_length_00 = ZeroCrossingEngine(pdVar21,uVar38,dVar71,pdVar24,intervals_00);
    for (uVar43 = 0; uVar60 != uVar43; uVar43 = uVar43 + 1) {
      pdVar21[uVar43] = pdVar21[uVar43] - pdVar21[uVar43 + 1];
    }
    x_length_01 = ZeroCrossingEngine(pdVar21,uVar55,dVar71,pdVar25,intervals_01);
    for (uVar43 = 0; uVar60 != uVar43; uVar43 = uVar43 + 1) {
      pdVar21[uVar43] = -pdVar21[uVar43];
    }
    x_length_02 = ZeroCrossingEngine(pdVar21,uVar55,dVar71,interval_locations,intervals_02);
    if ((((uVar14 < 3) || (x_length_00 < 3)) || (x_length_01 < 3)) || (x_length_02 < 3)) {
      for (uVar43 = 0; uVar42 != uVar43; uVar43 = uVar43 + 1) {
        *(undefined8 *)(lVar59 + uVar43 * 8) = 0;
      }
    }
    else {
      for (lVar56 = 0; uVar2 = forwardFFT._0_8_, lVar56 != 4; lVar56 = lVar56 + 1) {
        pvVar20 = operator_new__(uVar34);
        *(void **)(&forwardFFT.n + lVar56 * 2) = pvVar20;
      }
      interp1(pdVar22,intervals,uVar14,pdVar35,uVar54,(double *)forwardFFT._0_8_);
      uVar7 = forwardFFT._8_8_;
      interp1(pdVar24,intervals_00,x_length_00,pdVar35,uVar54,(double *)forwardFFT._8_8_);
      padVar23 = forwardFFT.c_in;
      interp1(pdVar25,intervals_01,x_length_01,pdVar35,uVar54,*forwardFFT.c_in);
      pdVar8 = forwardFFT.in;
      interp1(interval_locations,intervals_02,x_length_02,pdVar35,uVar54,forwardFFT.in);
      for (uVar43 = 0; uVar42 != uVar43; uVar43 = uVar43 + 1) {
        dVar68 = (*(double *)(uVar2 + uVar43 * 8) + *(double *)(uVar7 + uVar43 * 8) +
                  (*padVar23)[uVar43] + pdVar8[uVar43]) * 0.25;
        *(ulong *)(lVar59 + uVar43 * 8) =
             ~-(ulong)(dVar68 < f0_floor) &
             ~-(ulong)(f0_ceil < dVar68) &
             ~-(ulong)(dVar67 * 1.1 < dVar68) & ~-(ulong)(dVar68 < dVar67 * 0.9) & (ulong)dVar68;
      }
      for (lVar59 = 0; lVar59 != 4; lVar59 = lVar59 + 1) {
        if (*(void **)(&forwardFFT.n + lVar59 * 2) != (void *)0x0) {
          operator_delete__(*(void **)(&forwardFFT.n + lVar59 * 2));
        }
      }
    }
    operator_delete__(pdVar22);
    operator_delete__(pdVar24);
    operator_delete__(pdVar25);
    operator_delete__(interval_locations);
    operator_delete__(intervals);
    operator_delete__(intervals_00);
    operator_delete__(intervals_01);
    operator_delete__(intervals_02);
    operator_delete__(pdVar21);
  }
  uVar28 = uVar49 * 4;
  if (iVar9 < -1) {
    uVar28 = 0xffffffffffffffff;
  }
  puVar26 = (undefined4 *)operator_new__(uVar28);
  pvVar20 = operator_new__(uVar28);
  pvVar27 = operator_new__(uVar28);
  uVar28 = 0;
  uVar10 = 0;
  do {
    if (uVar28 == uVar42) {
      operator_delete__(puVar26);
      operator_delete__(pvVar20);
      operator_delete__(pvVar27);
      uVar49 = 0;
      if (0 < (int)uVar10) {
        uVar49 = (ulong)uVar10;
      }
      lVar61 = 1;
      lVar40 = 8;
      plVar46 = plVar17;
      lVar59 = lVar16;
      while( true ) {
        lVar59 = lVar59 + -1;
        plVar46 = plVar46 + 1;
        lVar56 = 0;
        if (0 < lVar59) {
          lVar56 = lVar59;
        }
        if (lVar61 == 4) break;
        for (uVar28 = 0; uVar28 != uVar49; uVar28 = uVar28 + 1) {
          for (lVar58 = 0; plVar57 = plVar17, lVar44 = lVar56, lVar61 + lVar58 < lVar16;
              lVar58 = lVar58 + 1) {
            *(undefined8 *)(uVar28 * 8 + plVar46[lVar58] + lVar61 * (int)uVar10 * 8) =
                 *(undefined8 *)(plVar17[lVar58] + uVar28 * 8);
          }
          while (lVar44 != 0) {
            *(undefined8 *)(uVar28 * 8 + *plVar57 + (lVar61 + 3) * (long)(int)uVar10 * 8) =
                 *(undefined8 *)(*(long *)((long)plVar57 + lVar40) + uVar28 * 8);
            plVar57 = plVar57 + 1;
            lVar44 = lVar44 + -1;
          }
        }
        lVar61 = lVar61 + 1;
        lVar40 = lVar40 + 8;
      }
      for (uVar49 = 0; uVar62 != uVar49; uVar49 = uVar49 + 1) {
        pvVar20 = *(void **)((long)pvVar19 + uVar49 * 8);
        if (pvVar20 != (void *)0x0) {
          operator_delete__(pvVar20);
        }
      }
      operator_delete__(pvVar19);
      uVar38 = uVar10 * 7;
      uVar49 = 0;
      if (0 < (int)uVar38) {
        uVar49 = (ulong)uVar38;
      }
      for (uVar28 = 0; uVar28 != uVar42; uVar28 = uVar28 + 1) {
        for (uVar62 = 0; uVar62 != uVar49; uVar62 = uVar62 + 1) {
          lVar61 = plVar17[uVar28];
          dVar67 = *(double *)(lVar61 + uVar62 * 8);
          lVar40 = *(long *)((long)pvVar18 + uVar28 * 8);
          if (dVar67 <= 0.0) {
            *(undefined8 *)(lVar61 + uVar62 * 8) = 0;
            *(undefined8 *)(lVar40 + uVar62 * 8) = 0;
          }
          else {
            iVar9 = (int)((dVar71 * 1.5) / dVar67 + 1.0);
            dVar68 = pdVar35[uVar28];
            uVar14 = iVar9 * 2 + 1;
            lVar59 = (long)(int)uVar14;
            uVar45 = lVar59 * 8;
            if (iVar9 < 0) {
              uVar45 = 0xffffffffffffffff;
            }
            pdVar21 = (double *)operator_new__(uVar45);
            uVar52 = 0;
            if (0 < (int)uVar14) {
              uVar52 = (ulong)uVar14;
            }
            for (uVar48 = 0; uVar52 != uVar48; uVar48 = uVar48 + 1) {
              pdVar21[uVar48] = (double)((int)uVar48 - iVar9) / dVar71;
            }
            dVar69 = (double)iVar9 + (double)iVar9 + 1.0;
            dVar70 = log(dVar69);
            dVar70 = exp2((double)(int)(dVar70 / 0.6931471805599453) + 2.0);
            iVar12 = (int)dVar70;
            forwardFFT.w = (double *)0x0;
            forwardFFT.input = (double *)0x0;
            forwardFFT.ip = (int *)0x0;
            forwardFFT.c_out = (fft_complex *)0x0;
            forwardFFT.out = (double *)0x0;
            forwardFFT.c_in = (fft_complex *)0x0;
            forwardFFT.in = (double *)0x0;
            forwardFFT.n = 0;
            forwardFFT.sign = 0;
            forwardFFT.flags = 0;
            forwardFFT._12_4_ = 0;
            InitializeForwardRealFFT(iVar12,(ForwardRealFFT *)&forwardFFT);
            lVar56 = (long)iVar12;
            uVar48 = lVar56 << 4;
            if (iVar12 < 0) {
              uVar48 = 0xffffffffffffffff;
            }
            pvVar19 = operator_new__(uVar48);
            pvVar20 = operator_new__(uVar48);
            uVar48 = lVar59 * 4;
            if (iVar9 < 0) {
              uVar48 = 0xffffffffffffffff;
            }
            pvVar27 = operator_new__(uVar48);
            pvVar29 = operator_new__(uVar45);
            pdVar22 = (double *)operator_new__(uVar45);
            iVar39 = matlab_round((*pdVar21 + dVar68) * dVar71 + 0.001);
            for (uVar45 = 0; uVar52 != uVar45; uVar45 = uVar45 + 1) {
              *(int *)((long)pvVar27 + uVar45 * 4) = iVar39 + (int)uVar45;
            }
            dVar69 = dVar69 / dVar71;
            for (uVar45 = 0; uVar52 != uVar45; uVar45 = uVar45 + 1) {
              dVar70 = ((double)*(int *)((long)pvVar27 + uVar45 * 4) + -1.0) / dVar71 - dVar68;
              dVar6 = cos((dVar70 * 6.283185307179586) / dVar69);
              dVar70 = cos((dVar70 * 12.566370614359172) / dVar69);
              *(double *)((long)pvVar29 + uVar45 * 8) = dVar70 * 0.08 + dVar6 * 0.5 + 0.42;
            }
            *pdVar22 = *(double *)((long)pvVar29 + 8) * -0.5;
            for (lVar58 = 1; lVar58 < iVar9 * 2; lVar58 = lVar58 + 1) {
              pdVar22[lVar58] =
                   (*(double *)((long)pvVar29 + lVar58 * 8 + 8) -
                   *(double *)((long)pvVar29 + lVar58 * 8 + -8)) * -0.5;
            }
            pdVar22[iVar9 * 2] = *(double *)((long)pvVar29 + lVar59 * 8 + -0x10) * 0.5;
            uVar45 = lVar59 * 4;
            if (iVar9 < 0) {
              uVar45 = 0xffffffffffffffff;
            }
            pvVar30 = operator_new__(uVar45);
            for (uVar45 = 0; uVar52 != uVar45; uVar45 = uVar45 + 1) {
              uVar14 = *(int *)((long)pvVar27 + uVar45 * 4) - 1;
              if ((int)uVar55 < (int)uVar14) {
                uVar14 = uVar55;
              }
              if ((int)uVar14 < 1) {
                uVar14 = 0;
              }
              *(uint *)((long)pvVar30 + uVar45 * 4) = uVar14;
            }
            for (uVar45 = 0; lVar58 = lVar59, uVar52 != uVar45; uVar45 = uVar45 + 1) {
              *(double *)(forwardFFT._8_8_ + uVar45 * 8) =
                   in[*(int *)((long)pvVar30 + uVar45 * 4)] *
                   *(double *)((long)pvVar29 + uVar45 * 8);
            }
            for (; lVar58 < lVar56; lVar58 = lVar58 + 1) {
              *(undefined8 *)(forwardFFT._8_8_ + lVar58 * 8) = 0;
            }
            ppdVar37 = &forwardFFT.in;
            puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
            for (lVar58 = 9; lVar58 != 0; lVar58 = lVar58 + -1) {
              *puVar53 = *ppdVar37;
              ppdVar37 = ppdVar37 + (ulong)bVar64 * -2 + 1;
              puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
            }
            p_02.sign = in_stack_fffffffffffffd4c;
            p_02.n = in_stack_fffffffffffffd48;
            p_02._8_8_ = in_stack_fffffffffffffd50;
            p_02.c_in = (fft_complex *)in_stack_fffffffffffffd58._0_8_;
            p_02.in = (double *)in_stack_fffffffffffffd58._8_8_;
            p_02.c_out = (fft_complex *)in_stack_fffffffffffffd58._16_8_;
            p_02.out = (double *)in_stack_fffffffffffffd58._24_8_;
            p_02.input = (double *)in_stack_fffffffffffffd58._32_8_;
            p_02.ip = (int *)in_stack_fffffffffffffd58._40_8_;
            p_02.w = (double *)in_stack_fffffffffffffd58._48_8_;
            fft_execute(p_02);
            iVar39 = iVar12 / 2;
            iVar9 = -1;
            if (-1 < iVar39) {
              iVar9 = iVar39;
            }
            lVar44 = (ulong)(iVar9 + 1) << 4;
            for (lVar58 = 0; lVar44 != lVar58; lVar58 = lVar58 + 0x10) {
              *(undefined8 *)((long)pvVar19 + lVar58) =
                   *(undefined8 *)((long)*forwardFFT.c_in + lVar58);
              *(undefined8 *)((long)pvVar19 + lVar58 + 8) =
                   *(undefined8 *)((long)*forwardFFT.c_in + lVar58 + 8);
            }
            for (uVar45 = 0; uVar52 != uVar45; uVar45 = uVar45 + 1) {
              *(double *)(forwardFFT._8_8_ + uVar45 * 8) =
                   in[*(int *)((long)pvVar30 + uVar45 * 4)] * pdVar22[uVar45];
            }
            for (; lVar59 < lVar56; lVar59 = lVar59 + 1) {
              *(undefined8 *)(forwardFFT._8_8_ + lVar59 * 8) = 0;
            }
            ppdVar37 = &forwardFFT.in;
            puVar53 = (undefined8 *)&stack0xfffffffffffffd48;
            for (lVar59 = 9; lVar59 != 0; lVar59 = lVar59 + -1) {
              *puVar53 = *ppdVar37;
              ppdVar37 = ppdVar37 + (ulong)bVar64 * -2 + 1;
              puVar53 = puVar53 + (ulong)bVar64 * -2 + 1;
            }
            p_03.sign = in_stack_fffffffffffffd4c;
            p_03.n = in_stack_fffffffffffffd48;
            p_03._8_8_ = in_stack_fffffffffffffd50;
            p_03.c_in = (fft_complex *)in_stack_fffffffffffffd58._0_8_;
            p_03.in = (double *)in_stack_fffffffffffffd58._8_8_;
            p_03.c_out = (fft_complex *)in_stack_fffffffffffffd58._16_8_;
            p_03.out = (double *)in_stack_fffffffffffffd58._24_8_;
            p_03.input = (double *)in_stack_fffffffffffffd58._32_8_;
            p_03.ip = (int *)in_stack_fffffffffffffd58._40_8_;
            p_03.w = (double *)in_stack_fffffffffffffd58._48_8_;
            fft_execute(p_03);
            for (lVar59 = 0; lVar44 != lVar59; lVar59 = lVar59 + 0x10) {
              *(undefined8 *)((long)pvVar20 + lVar59) =
                   *(undefined8 *)((long)*forwardFFT.c_in + lVar59);
              *(undefined8 *)((long)pvVar20 + lVar59 + 8) =
                   *(undefined8 *)((long)*forwardFFT.c_in + lVar59 + 8);
            }
            operator_delete__(pvVar30);
            uVar45 = (long)iVar39 * 8 + 8;
            if (iVar12 < -3) {
              uVar45 = 0xffffffffffffffff;
            }
            pvVar30 = operator_new__(uVar45);
            pvVar31 = operator_new__(uVar45);
            uVar14 = iVar39 + 1U;
            if ((int)(iVar39 + 1U) < 1) {
              uVar14 = 0;
            }
            uVar45 = (ulong)uVar14;
            lVar59 = 4;
            while (bVar63 = uVar45 != 0, uVar45 = uVar45 - 1, bVar63) {
              dVar68 = *(double *)((long)pvVar19 + lVar59 * 2 + -8);
              dVar69 = *(double *)((long)pvVar19 + lVar59 * 2);
              *(double *)((long)pvVar31 + lVar59 + -4) =
                   *(double *)((long)pvVar20 + lVar59 * 2) * dVar68 -
                   *(double *)((long)pvVar20 + lVar59 * 2 + -8) * dVar69;
              *(double *)((long)pvVar30 + lVar59 + -4) = dVar68 * dVar68 + dVar69 * dVar69;
              lVar59 = lVar59 + 8;
            }
            uVar14 = (uint)((dVar71 * 0.5) / dVar67);
            uVar45 = 6;
            if ((int)uVar14 < 6) {
              uVar45 = (ulong)uVar14;
            }
            uVar52 = uVar45 * 8;
            if ((int)uVar14 < 0) {
              uVar52 = 0xffffffffffffffff;
            }
            pvVar32 = operator_new__(uVar52);
            pvVar33 = operator_new__(uVar52);
            uVar52 = 0;
            if (0 < (int)uVar45) {
              uVar52 = uVar45;
            }
            auVar5._8_4_ = 0x54442d18;
            auVar5._0_8_ = (double)iVar12;
            auVar5._12_4_ = 0x400921fb;
            for (uVar48 = 0; uVar52 != uVar48; uVar48 = uVar48 + 1) {
              iVar9 = matlab_round((double)((int)uVar48 + 1) * (((double)iVar12 * dVar67) / dVar71))
              ;
              dVar68 = *(double *)((long)pvVar30 + (long)iVar9 * 8);
              dVar69 = 0.0;
              if ((dVar68 != 0.0) || (NAN(dVar68))) {
                auVar73._0_8_ = (double)iVar9 * dVar71;
                auVar73._8_8_ =
                     (*(double *)((long)pvVar31 + (long)iVar9 * 8) / dVar68) * dVar71 * 0.5;
                auVar74 = divpd(auVar73,auVar5);
                dVar69 = auVar74._8_8_ + auVar74._0_8_;
              }
              *(double *)((long)pvVar33 + uVar48 * 8) = dVar69;
              if (dVar68 < 0.0) {
                dVar68 = sqrt(dVar68);
              }
              else {
                dVar68 = SQRT(dVar68);
              }
              *(double *)((long)pvVar32 + uVar48 * 8) = dVar68;
            }
            dVar68 = 0.0;
            dVar69 = 0.0;
            dVar70 = 0.0;
            uVar48 = 0;
            while (uVar52 != uVar48) {
              dVar6 = *(double *)((long)pvVar33 + uVar48 * 8);
              dVar72 = (double)(int)(uVar48 + 1);
              dVar1 = *(double *)((long)pvVar32 + uVar48 * 8);
              dVar68 = dVar68 + dVar72 * dVar1;
              dVar69 = dVar69 + dVar6 * dVar1;
              dVar70 = dVar70 + ABS((dVar6 / dVar72 - dVar67) / dVar67);
              uVar48 = uVar48 + 1;
            }
            *(double *)(lVar40 + uVar62 * 8) = dVar70;
            *(double *)(lVar61 + uVar62 * 8) = dVar69 / (dVar68 + 1e-12);
            *(double *)(lVar40 + uVar62 * 8) =
                 1.0 / (*(double *)(lVar40 + uVar62 * 8) / (double)(int)uVar45 + 1e-12);
            operator_delete__(pvVar32);
            operator_delete__(pvVar33);
            operator_delete__(pvVar20);
            operator_delete__(pdVar22);
            operator_delete__(pvVar29);
            operator_delete__(pvVar27);
            operator_delete__(pvVar31);
            operator_delete__(pvVar30);
            operator_delete__(pvVar19);
            DestroyForwardRealFFT((ForwardRealFFT *)&forwardFFT);
            dVar67 = *(double *)(lVar61 + uVar62 * 8);
            if (((dVar67 < f0_floor) || (f0_ceil < dVar67)) ||
               (pdVar22 = (double *)(lVar40 + uVar62 * 8), *pdVar22 <= 2.5 && *pdVar22 != 2.5)) {
              *(undefined8 *)(lVar61 + uVar62 * 8) = 0;
              *(undefined8 *)(lVar40 + uVar62 * 8) = 0;
            }
            operator_delete__(pdVar21);
          }
        }
      }
      pvVar19 = operator_new__(uVar34);
      uVar34 = (ulong)uVar38 << 3;
      if ((int)uVar10 < 0) {
        uVar34 = 0xffffffffffffffff;
      }
      for (uVar28 = 0; uVar42 != uVar28; uVar28 = uVar28 + 1) {
        pvVar20 = operator_new__(uVar34);
        *(void **)((long)pvVar19 + uVar28 * 8) = pvVar20;
      }
      for (uVar34 = 0; uVar34 != uVar42; uVar34 = uVar34 + 1) {
        for (uVar28 = 0; uVar49 != uVar28; uVar28 = uVar28 + 1) {
          *(undefined8 *)(*(long *)((long)pvVar19 + uVar34 * 8) + uVar28 * 8) =
               *(undefined8 *)(plVar17[uVar34] + uVar28 * 8);
        }
      }
      for (lVar61 = 1; lVar61 < lVar41; lVar61 = lVar61 + 1) {
        for (uVar34 = 0; uVar49 != uVar34; uVar34 = uVar34 + 1) {
          lVar40 = plVar17[lVar61];
          dVar71 = *(double *)(lVar40 + uVar34 * 8);
          if ((dVar71 != 0.0) || (NAN(dVar71))) {
            SelectBestF0(dVar71,*(double **)((long)pvVar19 + lVar61 * 8 + 8),uVar38,1.0,
                         (double *)&forwardFFT);
            SelectBestF0(dVar71,*(double **)((long)pvVar19 + lVar61 * 8 + -8),uVar38,1.0,&error2);
            iVar9 = forwardFFT.n;
            iVar12 = forwardFFT.sign;
            if (error2 <= (double)forwardFFT._0_8_) {
              iVar9 = SUB84(error2,0);
              iVar12 = (int)((ulong)error2 >> 0x20);
            }
            if (0.05 < (double)CONCAT44(iVar12,iVar9)) {
              *(undefined8 *)(lVar40 + uVar34 * 8) = 0;
              *(undefined8 *)(*(long *)((long)pvVar18 + lVar61 * 8) + uVar34 * 8) = 0;
            }
          }
        }
      }
      for (uVar34 = 0; uVar42 != uVar34; uVar34 = uVar34 + 1) {
        pvVar20 = *(void **)((long)pvVar19 + uVar34 * 8);
        if (pvVar20 != (void *)0x0) {
          operator_delete__(pvVar20);
        }
      }
      operator_delete__(pvVar19);
      pvVar19 = operator_new__(uVar47);
      pdVar35 = (double *)operator_new__(uVar47);
      pdVar21 = (double *)operator_new__(uVar47);
      for (uVar34 = 0; uVar34 != uVar42; uVar34 = uVar34 + 1) {
        pdVar35[uVar34] = 0.0;
        uVar65 = 0;
        uVar66 = 0;
        for (uVar28 = 0; uVar49 != uVar28; uVar28 = uVar28 + 1) {
          dVar71 = *(double *)(*(long *)((long)pvVar18 + uVar34 * 8) + uVar28 * 8);
          if ((double)CONCAT44(uVar66,uVar65) <= dVar71 && dVar71 != (double)CONCAT44(uVar66,uVar65)
             ) {
            pdVar35[uVar34] = *(double *)(plVar17[uVar34] + uVar28 * 8);
            uVar65 = SUB84(dVar71,0);
            uVar66 = (undefined4)((ulong)dVar71 >> 0x20);
          }
        }
      }
      for (uVar49 = 0; uVar42 != uVar49; uVar49 = uVar49 + 1) {
        pdVar21[uVar49] = 0.0;
      }
      for (lVar61 = 2; lVar61 < lVar16; lVar61 = lVar61 + 1) {
        dVar71 = pdVar35[lVar61];
        if ((dVar71 != 0.0) || (NAN(dVar71))) {
          dVar67 = pdVar35[lVar61 + -1];
          dVar68 = (dVar67 + dVar67) - pdVar35[lVar61 + -2];
          if ((ABS((dVar71 - dVar68) / dVar68) <= 0.008) ||
             (dVar68 = 0.0, ABS(dVar71 - dVar67) / dVar67 <= 0.008)) {
            dVar68 = dVar71;
          }
          pdVar21[lVar61] = dVar68;
        }
      }
      for (uVar49 = 0; uVar42 != uVar49; uVar49 = uVar49 + 1) {
        pdVar35[uVar49] = pdVar21[uVar49];
      }
      uVar49 = lVar16 << 2;
      if (iVar11 < -1) {
        uVar49 = 0xffffffffffffffff;
      }
      piVar36 = (int *)operator_new__(uVar49);
      iVar9 = GetBoundaryList(pdVar21,uVar54,piVar36);
      uVar34 = (long)iVar9 / 2 & 0xffffffff;
      uVar28 = 0;
      if ((int)((long)iVar9 / 2) < 1) {
        uVar34 = 0;
      }
      for (; uVar28 != uVar34; uVar28 = uVar28 + 1) {
        iVar9 = piVar36[uVar28 * 2 + 1];
        lVar61 = (long)piVar36[uVar28 * 2];
        if (iVar9 - piVar36[uVar28 * 2] < 6) {
          for (; lVar61 <= iVar9; lVar61 = lVar61 + 1) {
            pdVar35[lVar61] = 0.0;
          }
        }
      }
      operator_delete__(piVar36);
      for (uVar34 = 0; uVar42 != uVar34; uVar34 = uVar34 + 1) {
        pdVar21[uVar34] = pdVar35[uVar34];
      }
      uVar34 = lVar16 << 2;
      if (iVar11 < -1) {
        uVar34 = 0xffffffffffffffff;
      }
      piVar36 = (int *)operator_new__(uVar34);
      iVar9 = GetBoundaryList(pdVar35,uVar54,piVar36);
      iVar12 = (int)((long)iVar9 / 2);
      uVar34 = (long)iVar12 * 8;
      if (iVar9 < -1) {
        uVar34 = 0xffffffffffffffff;
      }
      ppdVar37 = (double **)operator_new__(uVar34);
      uVar28 = 0;
      uVar34 = (long)iVar9 / 2 & 0xffffffff;
      if (iVar12 < 1) {
        uVar34 = uVar28;
      }
      for (; uVar34 != uVar28; uVar28 = uVar28 + 1) {
        pdVar22 = (double *)operator_new__(uVar47);
        ppdVar37[uVar28] = pdVar22;
      }
      GetMultiChannelF0(pdVar35,uVar54,piVar36,iVar9,ppdVar37);
      for (uVar28 = 0; uVar34 != uVar28; uVar28 = uVar28 + 1) {
        f0_candidates = (double **)ppdVar37[uVar28];
        iVar9 = piVar36[uVar28 * 2 + 1] + 100;
        if (iVar11 + -1 < iVar9) {
          iVar9 = iVar11 + -1;
        }
        iVar9 = ExtendF0((double *)(ulong)(uint)piVar36[uVar28 * 2 + 1],iVar9,1,(int)plVar17,uVar38,
                         f0_candidates,in_stack_fffffffffffffd48,channels_in_octave,
                         in_stack_fffffffffffffd50);
        piVar36[uVar28 * 2 + 1] = iVar9;
        uVar10 = piVar36[uVar28 * 2];
        uVar55 = 0x65;
        if (0x65 < (int)uVar10) {
          uVar55 = uVar10;
        }
        iVar9 = ExtendF0((double *)(ulong)uVar10,uVar55 - 100,-1,(int)plVar17,uVar38,f0_candidates,
                         in_stack_fffffffffffffd48,channels_in_octave,in_stack_fffffffffffffd50);
        piVar36[uVar28 * 2] = iVar9;
      }
      uVar28 = 0;
      dVar71 = 0.0;
      uVar47 = 0;
      while( true ) {
        iVar9 = (int)uVar47;
        lVar61 = (long)iVar9;
        if (uVar28 == uVar34) break;
        iVar12 = piVar36[uVar28 * 2];
        iVar39 = piVar36[uVar28 * 2 + 1];
        for (lVar40 = (long)iVar12; lVar40 < iVar39; lVar40 = lVar40 + 1) {
          dVar71 = dVar71 + ppdVar37[uVar28][lVar40];
        }
        dVar71 = dVar71 / (double)(iVar39 - iVar12);
        if (2200.0 / dVar71 < (double)(iVar39 - iVar12)) {
          uVar47 = (ulong)(iVar9 + 1);
          pdVar22 = ppdVar37[lVar61];
          ppdVar37[lVar61] = ppdVar37[uVar28];
          ppdVar37[uVar28] = pdVar22;
          uVar2 = *(undefined8 *)(piVar36 + iVar9 * 2);
          piVar36[iVar9 * 2] = iVar12;
          piVar36[iVar9 * 2 + 1] = iVar39;
          *(undefined8 *)(piVar36 + uVar28 * 2) = uVar2;
        }
        uVar28 = uVar28 + 1;
      }
      if (iVar9 != 0) {
        uVar62 = 0;
        uVar28 = lVar61 * 4;
        if (iVar9 < 0) {
          uVar28 = 0xffffffffffffffff;
        }
        if (iVar9 < 1) {
          uVar47 = 0;
        }
        pvVar20 = operator_new__(uVar28);
        for (; uVar47 != uVar62; uVar62 = uVar62 + 1) {
          *(int *)((long)pvVar20 + uVar62 * 4) = (int)uVar62;
        }
        for (lVar40 = 1; lVar16 = lVar40, lVar40 < lVar61; lVar40 = lVar40 + 1) {
          for (; 0 < lVar16; lVar16 = lVar16 + -1) {
            iVar9 = *(int *)((long)pvVar20 + lVar16 * 4 + -4);
            iVar12 = *(int *)((long)pvVar20 + lVar40 * 4);
            if (piVar36[(long)iVar9 * 2] <= piVar36[(long)iVar12 * 2]) break;
            *(int *)((long)pvVar20 + lVar40 * 4) = iVar9;
            *(int *)((long)pvVar20 + lVar16 * 4 + -4) = iVar12;
          }
        }
        for (uVar28 = 0; uVar42 != uVar28; uVar28 = uVar28 + 1) {
          pdVar21[uVar28] = (*ppdVar37)[uVar28];
        }
        for (lVar40 = 1; lVar40 < lVar61; lVar40 = lVar40 + 1) {
          iVar9 = *(int *)((long)pvVar20 + lVar40 * 4);
          lVar16 = (long)iVar9;
          uVar10 = iVar9 * 2;
          iVar9 = piVar36[lVar16 * 2];
          lVar59 = (long)iVar9;
          iVar12 = piVar36[1];
          if (iVar12 < iVar9) {
            iVar12 = piVar36[(int)(uVar10 | 1)];
            for (; lVar59 <= iVar12; lVar59 = lVar59 + 1) {
              pdVar21[lVar59] = ppdVar37[lVar16][lVar59];
            }
            *piVar36 = iVar9;
          }
          else {
            pdVar22 = ppdVar37[lVar16];
            iVar39 = piVar36[(int)(uVar10 | 1)];
            if ((iVar9 < *piVar36) || (iVar12 < iVar39)) {
              lVar56 = (long)iVar12;
              local_268 = 0.0;
              dVar71 = 0.0;
              for (lVar16 = lVar59; lVar16 <= lVar56; lVar16 = lVar16 + 1) {
                pdVar24 = (double *)plVar17[lVar16];
                pdVar25 = *(double **)((long)pvVar18 + lVar16 * 8);
                dVar67 = SearchScore(pdVar21[lVar16],pdVar24,pdVar25,uVar38);
                local_268 = local_268 + dVar67;
                dVar67 = SearchScore(pdVar22[lVar16],pdVar24,pdVar25,uVar38);
                dVar71 = dVar71 + dVar67;
              }
              iVar12 = iVar39;
              if (local_268 <= dVar71) {
                for (; lVar59 <= iVar39; lVar59 = lVar59 + 1) {
                  pdVar21[lVar59] = pdVar22[lVar59];
                }
              }
              else {
                for (; lVar56 <= iVar39; lVar56 = lVar56 + 1) {
                  pdVar21[lVar56] = pdVar22[lVar56];
                }
              }
            }
          }
          piVar36[1] = iVar12;
        }
        operator_delete__(pvVar20);
      }
      for (uVar28 = 0; uVar34 != uVar28; uVar28 = uVar28 + 1) {
        if (ppdVar37[uVar28] != (double *)0x0) {
          operator_delete__(ppdVar37[uVar28]);
        }
      }
      operator_delete__(ppdVar37);
      operator_delete__(piVar36);
      for (uVar34 = 0; uVar42 != uVar34; uVar34 = uVar34 + 1) {
        *(double *)((long)pvVar19 + uVar34 * 8) = pdVar21[uVar34];
      }
      piVar36 = (int *)operator_new__(uVar49);
      iVar12 = GetBoundaryList(pdVar21,uVar54,piVar36);
      iVar9 = 1;
      if (1 < iVar12 / 2) {
        iVar9 = iVar12 / 2;
      }
      uVar49 = 0;
      while (uVar49 != iVar9 - 1) {
        uVar34 = uVar49 + 1;
        iVar12 = piVar36[uVar49 * 2 + 2];
        lVar61 = (long)piVar36[uVar49 * 2 + 1];
        iVar39 = ~piVar36[uVar49 * 2 + 1] + iVar12;
        uVar49 = uVar34;
        if (iVar39 < 9) {
          dVar71 = pdVar21[lVar61];
          dVar67 = pdVar21[iVar12];
          dVar68 = 1.0;
          for (; lVar61 < iVar12 + -1; lVar61 = lVar61 + 1) {
            dVar69 = (((dVar67 + -1.0) - (dVar71 + 1.0)) / ((double)iVar39 + 1.0)) * dVar68;
            dVar68 = dVar68 + 1.0;
            *(double *)((long)pvVar19 + lVar61 * 8 + 8) = dVar69 + dVar71 + 1.0;
          }
        }
      }
      operator_delete__(piVar36);
      operator_delete__(pdVar35);
      operator_delete__(pdVar21);
      uVar10 = iVar11 + 0x259;
      lVar61 = (long)(int)uVar10;
      uVar49 = lVar61 * 8;
      if (iVar11 < -0x259) {
        uVar49 = 0xffffffffffffffff;
      }
      pdVar35 = (double *)operator_new__(uVar49);
      for (lVar40 = 0; lVar40 != 300; lVar40 = lVar40 + 1) {
        pdVar35[lVar40] = 0.0;
      }
      lVar40 = (long)(iVar11 + 0x12d);
      for (lVar16 = 300; lVar16 < lVar40; lVar16 = lVar16 + 1) {
        pdVar35[lVar16] = *(double *)((long)pvVar19 + lVar16 * 8 + -0x960);
      }
      for (; lVar40 < lVar61; lVar40 = lVar40 + 1) {
        pdVar35[lVar40] = 0.0;
      }
      uVar34 = lVar61 * 4;
      if (iVar11 < -0x259) {
        uVar34 = 0xffffffffffffffff;
      }
      piVar36 = (int *)operator_new__(uVar34);
      iVar9 = GetBoundaryList(pdVar35,uVar10,piVar36);
      iVar12 = (int)((long)iVar9 / 2);
      uVar34 = (long)iVar12 * 8;
      if (iVar9 < -1) {
        uVar34 = 0xffffffffffffffff;
      }
      ppdVar37 = (double **)operator_new__(uVar34);
      uVar28 = 0;
      uVar34 = (long)iVar9 / 2 & 0xffffffff;
      if (iVar12 < 1) {
        uVar34 = uVar28;
      }
      for (; uVar34 != uVar28; uVar28 = uVar28 + 1) {
        pdVar21 = (double *)operator_new__(uVar49);
        ppdVar37[uVar28] = pdVar21;
      }
      GetMultiChannelF0(pdVar35,uVar10,piVar36,iVar9,ppdVar37);
      uVar49 = lVar61 * 8;
      if (iVar11 < -0x259) {
        uVar49 = 0xffffffffffffffff;
      }
      uVar47 = 0;
      uVar28 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar28 = uVar47;
      }
      for (; uVar47 != uVar34; uVar47 = uVar47 + 1) {
        pdVar21 = ppdVar37[uVar47];
        uVar10 = piVar36[uVar47 * 2];
        lVar40 = (long)(int)uVar10;
        lVar16 = (long)piVar36[uVar47 * 2 + 1];
        pvVar20 = operator_new__(uVar49);
        uVar62 = 0;
        if (0 < (int)uVar10) {
          uVar62 = (ulong)uVar10;
        }
        for (uVar45 = 0; lVar59 = lVar16, uVar62 != uVar45; uVar45 = uVar45 + 1) {
          pdVar21[uVar45] = pdVar21[lVar40];
        }
        while (lVar59 = lVar59 + 1, lVar59 < lVar61) {
          pdVar21[lVar59] = pdVar21[lVar16];
        }
        dVar67 = 0.0;
        dVar71 = 0.0;
        iVar9 = iVar11 + 600;
        for (uVar62 = 0; uVar28 != uVar62; uVar62 = uVar62 + 1) {
          dVar68 = dVar67 * -0.7660066009432641 + dVar71 * 1.7347257688092754 + pdVar21[uVar62];
          *(double *)((long)pvVar20 + (long)iVar9 * 8) =
               dVar67 * 0.007820208033497172 +
               dVar68 * 0.007820208033497172 + dVar71 * 0.015640416066994345;
          iVar9 = iVar9 + -1;
          dVar67 = dVar71;
          dVar71 = dVar68;
        }
        dVar67 = 0.0;
        dVar71 = 0.0;
        iVar9 = iVar11 + 600;
        for (uVar62 = 0; uVar28 != uVar62; uVar62 = uVar62 + 1) {
          dVar68 = dVar67 * -0.7660066009432641 +
                   dVar71 * 1.7347257688092754 + *(double *)((long)pvVar20 + uVar62 * 8);
          pdVar35[iVar9] =
               dVar67 * 0.007820208033497172 +
               dVar68 * 0.007820208033497172 + dVar71 * 0.015640416066994345;
          iVar9 = iVar9 + -1;
          dVar67 = dVar71;
          dVar71 = dVar68;
        }
        operator_delete__(pvVar20);
        for (; lVar40 <= lVar16; lVar40 = lVar40 + 1) {
          temporal_positions[lVar40 + -300] = pdVar35[lVar40];
        }
      }
      for (uVar49 = 0; uVar34 != uVar49; uVar49 = uVar49 + 1) {
        if (ppdVar37[uVar49] != (double *)0x0) {
          operator_delete__(ppdVar37[uVar49]);
        }
      }
      operator_delete__(ppdVar37);
      operator_delete__(pdVar35);
      operator_delete__(piVar36);
      operator_delete__(in);
      operator_delete__(pvVar19);
      operator_delete__(out);
      for (lVar61 = 0; lVar61 <= lVar41; lVar61 = lVar61 + 1) {
        if ((void *)plVar17[lVar61] != (void *)0x0) {
          operator_delete__((void *)plVar17[lVar61]);
        }
        pvVar19 = *(void **)((long)pvVar18 + lVar61 * 8);
        if (pvVar19 != (void *)0x0) {
          operator_delete__(pvVar19);
        }
      }
      operator_delete__(plVar17);
      operator_delete__(pvVar18);
      operator_delete__(pdVar15);
      return;
    }
    for (uVar45 = 0; uVar62 != uVar45; uVar45 = uVar45 + 1) {
      puVar26[uVar45] =
           (uint)(0.0 < *(double *)(*(long *)((long)pvVar19 + uVar45 * 8) + uVar28 * 8));
    }
    puVar26[lVar61] = 0;
    *puVar26 = 0;
    uVar45 = 0;
    for (lVar40 = 1; iVar9 = (int)uVar45, lVar40 < (long)uVar49; lVar40 = lVar40 + 1) {
      pvVar29 = pvVar20;
      if (puVar26[lVar40] - puVar26[lVar40 + -1] == 1) {
LAB_0011f9b6:
        *(int *)((long)pvVar29 + (long)iVar9 * 4) = (int)lVar40;
      }
      else if (puVar26[lVar40] - puVar26[lVar40 + -1] == -1) {
        uVar45 = (ulong)(iVar9 + 1);
        pvVar29 = pvVar27;
        goto LAB_0011f9b6;
      }
    }
    lVar40 = plVar17[uVar28];
    uVar52 = 0;
    if (iVar9 < 1) {
      uVar45 = 0;
    }
    uVar38 = 0;
    for (; lVar59 = (long)(int)uVar38, uVar52 != uVar45; uVar52 = uVar52 + 1) {
      iVar9 = *(int *)((long)pvVar27 + uVar52 * 4);
      iVar39 = *(int *)((long)pvVar20 + uVar52 * 4);
      lVar56 = (long)iVar39;
      iVar39 = iVar9 - iVar39;
      if (9 < iVar39) {
        dVar67 = 0.0;
        for (; lVar56 < iVar9; lVar56 = lVar56 + 1) {
          dVar67 = dVar67 + *(double *)(*(long *)((long)pvVar19 + lVar56 * 8) + uVar28 * 8);
        }
        uVar38 = uVar38 + 1;
        *(double *)(lVar40 + lVar59 * 8) = dVar67 / (double)iVar39;
      }
    }
    for (; lVar59 < iVar12 * 7; lVar59 = lVar59 + 1) {
      *(undefined8 *)(lVar40 + lVar59 * 8) = 0;
    }
    if ((int)uVar10 <= (int)uVar38) {
      uVar10 = uVar38;
    }
    uVar28 = uVar28 + 1;
  } while( true );
}

Assistant:

static void HarvestGeneralBody(const double *x, int x_length, int fs,
    int frame_period, double f0_floor, double f0_ceil,
#if 0
    double channels_in_octave, int speed, double *temporal_positions,
    double *f0) {
#else
    double channels_in_octave, int speed, double allowed_range,
    double *temporal_positions, double *f0) {
#endif
  double adjusted_f0_floor = f0_floor * 0.9;
  double adjusted_f0_ceil = f0_ceil * 1.1;
  int number_of_channels =
    1 + static_cast<int>(log(adjusted_f0_ceil / adjusted_f0_floor) /
    world::kLog2 * channels_in_octave);
  double *boundary_f0_list = new double[number_of_channels];
  for (int i = 0; i < number_of_channels; ++i)
    boundary_f0_list[i] =
    adjusted_f0_floor * pow(2.0, (i + 1) / channels_in_octave);

  // normalization
  int decimation_ratio = MyMaxInt(MyMinInt(speed, 12), 1);
  int y_length =
    static_cast<int>(ceil(static_cast<double>(x_length) / decimation_ratio));
  double actual_fs = static_cast<double>(fs) / decimation_ratio;
  int fft_size = GetSuitableFFTSize(y_length + 5 +
    2 * static_cast<int>(2.0 * actual_fs / boundary_f0_list[0]));

  // Calculation of the spectrum used for the f0 estimation
  double *y = new double[fft_size];
  fft_complex *y_spectrum = new fft_complex[fft_size];
  GetWaveformAndSpectrum(x, x_length, y_length, actual_fs, fft_size,
      decimation_ratio, y, y_spectrum);

  int f0_length = GetSamplesForHarvest(fs, x_length, frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * frame_period / 1000.0;
    f0[i] = 0.0;
  }

  int overlap_parameter = 7;
  int max_candidates =
    matlab_round(number_of_channels / 10.0) * overlap_parameter;
  double **f0_candidates = new double *[f0_length];
  double **f0_candidates_score = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    f0_candidates[i] = new double[max_candidates];
    f0_candidates_score[i] = new double[max_candidates];
  }

  int number_of_candidates = HarvestGeneralBodySub(boundary_f0_list,
    number_of_channels, f0_length, actual_fs, y_length, temporal_positions,
    y_spectrum, fft_size, f0_floor, f0_ceil, max_candidates, f0_candidates) *
    overlap_parameter;

  RefineF0Candidates(y, y_length, actual_fs, temporal_positions, f0_length,
      number_of_candidates, f0_floor, f0_ceil, f0_candidates,
      f0_candidates_score);
  RemoveUnreliableCandidates(f0_length, number_of_candidates,
      f0_candidates, f0_candidates_score);

  double *best_f0_contour = new double[f0_length];
  FixF0Contour(f0_candidates, f0_candidates_score, f0_length,
#if 0
      number_of_candidates, best_f0_contour);
#else
      number_of_candidates, allowed_range, best_f0_contour);
#endif
  SmoothF0Contour(best_f0_contour, f0_length, f0);

  delete[] y;
  delete[] best_f0_contour;
  delete[] y_spectrum;
  for (int i = 0; i < f0_length; ++i) {
    delete[] f0_candidates[i];
    delete[] f0_candidates_score[i];
  }
  delete[] f0_candidates;
  delete[] f0_candidates_score;
  delete[] boundary_f0_list;
}